

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool __thiscall argo::json::operator!=(json *this,string *s)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  string *psVar4;
  bool bVar5;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  psVar4 = operator_cast_to_string_(this);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + psVar4->_M_string_length);
  puVar2 = local_40;
  if (local_38 == s->_M_string_length) {
    if (local_38 == 0) {
      bVar5 = false;
    }
    else {
      iVar3 = bcmp(local_40,(s->_M_dataplus)._M_p,local_38);
      bVar5 = iVar3 != 0;
    }
  }
  else {
    bVar5 = true;
  }
  if (puVar2 != local_30) {
    operator_delete(puVar2);
  }
  return bVar5;
}

Assistant:

bool json::operator!=(const std::string &s) const
{
    return static_cast<string>(*this) != s;
}